

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmSourceFile * __thiscall cmTarget::AddSourceCMP0049(cmTarget *this,string *s)

{
  pointer this_00;
  ulong uVar1;
  undefined1 local_40 [8];
  string src;
  string *s_local;
  cmTarget *this_local;
  
  src.field_2._8_8_ = s;
  this_00 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                      (&this->impl);
  cmTargetInternals::ProcessSourceItemCMP0049
            ((string *)local_40,this_00,(string *)src.field_2._8_8_);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) != 0)) {
    this_local = (cmTarget *)0x0;
  }
  else {
    this_local = (cmTarget *)AddSource(this,(string *)local_40,false);
  }
  std::__cxx11::string::~string((string *)local_40);
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmTarget::AddSourceCMP0049(const std::string& s)
{
  std::string src = impl->ProcessSourceItemCMP0049(s);
  if (!s.empty() && src.empty()) {
    return nullptr;
  }
  return this->AddSource(src);
}